

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0012(TypeCanonicalizerAndResolverTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  allocator<char> local_371;
  string local_370;
  Decl local_350;
  Decl local_288;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = "\ntypedef double x ;\nx y ( int w , x z ) ;\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\ntypedef double x ;\nx y ( int w , x z ) ;\n",&local_39);
  Expectation::Expectation(&local_1c0);
  Decl::Decl(&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"y",&local_371);
  pDVar1 = Decl::Function(&local_350,&local_370,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Double,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Int_S,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Double,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  Decl::Decl(&local_288,pDVar1);
  pEVar3 = Expectation::declaration(&local_1c0,&local_288);
  Expectation::Expectation(&local_108,pEVar3);
  canonicalizerAndResolveTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  Decl::~Decl(&local_288);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  Decl::~Decl(&local_350);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0012()
{
    auto s = R"(
typedef double x ;
x y ( int w , x z ) ;
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .declaration(Decl()
                         .Function("y")
                         .ty_.Basic(BasicTypeKind::Double)
                         .ty_.addParam().Basic(BasicTypeKind::Int_S)
                         .ty_.addParam().Basic(BasicTypeKind::Double)
                         .ty_.Derived(TypeKind::Function)));
}